

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_variable(Parser *parser,Modifier *modifier)

{
  Token *name;
  bool bVar1;
  void *expr;
  VarTerm *local_38;
  void *term;
  Type *var_type;
  Kind kid;
  Token *tok;
  Modifier *modifier_local;
  Parser *parser_local;
  
  name = parser->token;
  expect(parser,ID);
  break_newline(parser);
  var_type._4_4_ = parser->token->kind;
  term = (void *)0x0;
  if (var_type._4_4_ == COLON) {
    bmove(parser);
    bVar1 = is_basic_type(parser->token);
    if (bVar1 == 0) {
      expect(parser,ID);
    }
    else {
      bmove(parser);
    }
    term = new_type(parser->token);
    var_type._4_4_ = parser->token->kind;
  }
  else if (var_type._4_4_ != EQ) {
    break_newline(parser);
    log_debug(
             "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:182"
             );
    log_code(parser->lexer->source,parser->token->row_pos,parser->token->col_pos,
             "Variable type is ambiguous","");
  }
  local_38 = new_var_term(name,(void *)0x0,(Type *)term,modifier);
  bVar1 = is_operator(parser->token);
  if ((bVar1 != 0) || (var_type._4_4_ == EQ)) {
    if (var_type._4_4_ == EQ) {
      bmove(parser);
    }
    expr = parse_expr(parser);
    local_38 = new_var_term(name,expr,(Type *)term,modifier);
  }
  return local_38;
}

Assistant:

void *parse_variable(Parser *parser, Modifier *modifier) {
    Token *tok = token(parser);
    expect(parser, ID);
    break_newline(parser);
    Kind kid = token(parser)->kind;
    Type *var_type = NULL;
    if (kid == COLON) {
        bmove(parser);
        if (is_basic_type(token(parser))) {
            bmove(parser);
        } else {
            expect(parser, ID);
        }
        var_type = new_type(token(parser));
        kid = token(parser)->kind;
    } else if (kid != EQ) {
        break_newline(parser);
        parse_error(parser, "Variable type is ambiguous", "");
    }
    void *term = new_var_term(tok, NULL, var_type, modifier);
    if (is_operator(token(parser)) || kid == EQ) {
        if (kid == EQ) {
            bmove(parser);
        }
        term = new_var_term(tok, parse_expr(parser), var_type, modifier);
    }
    return term;
}